

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<float>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  size_type sVar6;
  _Base_ptr __k;
  fmt fVar7;
  bool bVar8;
  undefined1 uVar9;
  int iVar10;
  ostream *poVar11;
  undefined8 *puVar12;
  const_iterator cVar13;
  long *plVar14;
  long *plVar15;
  mapped_type *pmVar16;
  _Base_ptr p_Var17;
  Property *args;
  size_type __n;
  string *__v;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  stringstream ss;
  undefined1 local_5c0 [8];
  _Alloc_hider local_5b8;
  undefined1 local_5b0 [24];
  undefined1 local_598 [16];
  undefined1 local_588 [24];
  string local_570;
  Property *local_550;
  AttrMetas *local_548;
  UsdPrimvarReader_float *local_540;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_538;
  string *local_530;
  long *local_528 [2];
  long local_518 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  optional<tinyusdz::Animatable<float>> *local_4b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_4b0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_4a8;
  TypedTerminalAttribute<float> *local_4a0;
  _Base_ptr local_498;
  _Base_ptr local_490;
  undefined1 local_488 [16];
  undefined1 local_478 [96];
  ios_base local_418 [264];
  string local_310;
  string local_2f0 [16];
  undefined8 local_2e0 [2];
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [12];
  undefined4 uStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [32];
  undefined1 local_270 [24];
  undefined1 local_258 [24];
  ios_base aiStack_240 [16];
  ios_base aiStack_230 [8];
  bool local_228;
  storage_t<double> local_220;
  bool local_218;
  storage_t<tinyusdz::Token> local_210;
  undefined1 local_1f0 [48];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [40];
  undefined1 auStack_148 [16];
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  undefined4 local_e8 [8];
  size_t local_c8;
  undefined1 auStack_c0 [40];
  undefined1 auStack_98 [24];
  undefined1 local_80 [80];
  
  local_508._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_508._M_impl.super__Rb_tree_header._M_header;
  local_508._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_508._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_508._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_540 = preader;
  local_530 = warn;
  local_508._M_impl.super__Rb_tree_header._M_header._M_right =
       local_508._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
  }
  p_Var17 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_490 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var17 != local_490) {
    local_548 = &(local_540->fallback)._metas;
    local_4a8 = &(local_540->fallback)._paths;
    local_4b8 = (optional<tinyusdz::Animatable<float>> *)&(local_540->fallback)._attrib;
    local_538 = &local_540->varname;
    local_4a0 = &local_540->result;
    local_4b0 = &(local_540->super_ShaderNode).super_UsdShadePrim.props;
    do {
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d8,*(long *)(p_Var17 + 1),
                 (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
      local_550 = (Property *)(p_Var17 + 2);
      local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"inputs:fallback","");
      sVar6 = local_4d8._M_string_length;
      sVar5 = local_570._M_string_length;
      local_5b8._M_p = local_5b0 + 8;
      local_5b0._0_8_ = (char *)0x0;
      local_5b0._8_8_ = local_5b0._8_8_ & 0xffffffffffffff00;
      __n = local_4d8._M_string_length;
      if (local_570._M_string_length < local_4d8._M_string_length) {
        __n = local_570._M_string_length;
      }
      if (__n == 0) {
        if (local_4d8._M_string_length != local_570._M_string_length) goto LAB_00235e75;
LAB_00235b27:
        if (((ulong)p_Var17[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_5c0._0_4_ = 7;
          local_598._0_8_ = &DAT_0000003e;
          local_488._0_8_ = local_478;
          local_488._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_488,(ulong)local_598);
          local_478._0_8_ = local_598._0_8_;
          builtin_strncpy((char *)local_488._0_8_,
                          "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
          local_488._8_8_ = local_598._0_8_;
          *(char *)(local_488._0_8_ + local_598._0_8_) = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_488,&local_570,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_598._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_5b8,(string *)local_2b0);
          if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
          }
          if ((undefined1 *)local_488._0_8_ != local_478) {
            operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
          }
        }
        if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4a8,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var17[6]._M_parent);
          local_5c0 = (undefined1  [8])((ulong)local_5c0 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_((string *)local_598,&local_550->_attrib);
        local_2b0._0_8_ = local_2a0;
        stack0xfffffffffffffd58 = 5;
        local_2a0._0_6_ = 0x74616f6c66;
        if ((pointer)local_598._8_8_ == (pointer)0x5) {
          if ((char)*(int *)(local_598._0_8_ + 4) != 't' || *(int *)local_598._0_8_ != 0x616f6c66) {
            local_488._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
            local_478._0_6_ = 0x74616f6c66;
            local_488._0_8_ = local_478;
            if ((char)*(int *)(local_598._0_8_ + 4) != 't' || *(int *)local_598._0_8_ != 0x616f6c66)
            goto LAB_00235cff;
          }
          iVar10 = *(int *)((long)&p_Var17[0x17]._M_parent + 4);
          if (iVar10 == 1) {
            if (p_Var17[5]._M_left == p_Var17[5]._M_parent) {
              if (p_Var17[4]._M_right == (_Base_ptr)0x0) {
                bVar8 = false;
              }
              else {
                iVar10 = (**(code **)p_Var17[4]._M_right)();
                bVar8 = iVar10 == 4;
              }
              uVar9 = (undefined1)p_Var17[5]._M_color;
              if ((bVar8) || ((uVar9 & _S_black) != _S_red)) {
                (local_540->fallback)._blocked = true;
              }
            }
            else {
              uVar9 = (undefined1)p_Var17[5]._M_color;
            }
            if (((uVar9 & _S_black) != _S_red) || (p_Var17[4]._M_right == (_Base_ptr)0x0)) {
LAB_00236f1e:
              anon_unknown_0::ConvertToAnimatable<float>
                        ((optional<tinyusdz::Animatable<float>_> *)local_488,
                         (PrimVar *)&p_Var17[4]._M_parent);
              fVar7 = local_488[0];
              local_2b0[0] = local_488[0];
              if (local_488[0] == (fmt)0x1) {
                uStack_2a4._0_2_ = local_488._12_2_;
                local_2b0._8_4_ = local_488._8_4_;
                local_2a0._0_8_ = local_478._0_8_;
                local_2a0._8_8_ = local_478._8_8_;
                local_290._0_8_ = local_478._16_8_;
                local_290[8] = local_478[0x18];
                nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                          (local_4b8,(Animatable<float> *)(local_2b0 + 8));
                uVar9 = local_2b0[0];
              }
              else {
                local_5c0._0_4_ = 8;
                warn = (string *)0x55;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_5b8,0,(char *)local_5b0._0_8_,0x5d423e);
                uVar9 = fVar7;
              }
              if (((uVar9 & 1) != 0) &&
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_2a0._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                operator_delete((void *)local_2a0._0_8_,local_290._0_8_ - local_2a0._0_8_);
              }
              if (fVar7 == (fmt)0x0) goto LAB_00235e4e;
              goto LAB_00236ff1;
            }
            iVar10 = (**(code **)p_Var17[4]._M_right)();
            if (iVar10 != 0) {
              if (p_Var17[4]._M_right != (_Base_ptr)0x0) {
                iVar10 = (**(code **)p_Var17[4]._M_right)();
                if (iVar10 == 1) goto LAB_00236f0a;
              }
              goto LAB_00236f1e;
            }
LAB_00236f0a:
            if (p_Var17[5]._M_left != p_Var17[5]._M_parent) goto LAB_00236f1e;
            if (p_Var17[6]._M_left == p_Var17[6]._M_parent) goto LAB_00235e4e;
            AttrMetas::operator=(local_548,(AttrMetas *)(p_Var17 + 7));
            __v = (string *)&local_4d8;
          }
          else {
            if (iVar10 != 0) {
              warn = (string *)0x25;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_5b8,0,(char *)local_5b0._0_8_,0x5d3f70);
              local_5c0._0_4_ = 8;
              goto LAB_00235e4e;
            }
            (local_540->fallback)._value_empty = true;
LAB_00236ff1:
            AttrMetas::operator=(local_548,(AttrMetas *)(p_Var17 + 7));
            __v = &local_570;
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
          local_5c0 = (undefined1  [8])((ulong)local_5c0 & 0xffffffff00000000);
        }
        else {
LAB_00235cff:
          local_5c0._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"Property type mismatch. ",0x18);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0,local_570._M_dataplus._M_p,
                               local_570._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," expects type `",0xf);
          local_488._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
          local_478._0_6_ = 0x74616f6c66;
          local_488._0_8_ = local_478;
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_478,5);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"` but defined as type `",0x17);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)local_598._0_8_,local_598._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"`",1);
          if ((undefined1 *)local_488._0_8_ != local_478) {
            operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_5b8,(string *)local_488);
          if ((undefined1 *)local_488._0_8_ != local_478) {
            operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_230);
        }
LAB_00235e4e:
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588) {
          operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
        }
      }
      else {
        iVar10 = bcmp(local_4d8._M_dataplus._M_p,local_570._M_dataplus._M_p,__n);
        if ((sVar6 == sVar5) && (iVar10 == 0)) goto LAB_00235b27;
LAB_00235e75:
        local_5c0._0_4_ = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
      iVar10 = 0;
      if (((ulong)local_5c0 & 0xfffffffd) == 0) {
        iVar10 = 3;
LAB_00236131:
        bVar8 = false;
      }
      else {
        bVar8 = true;
        if (local_5c0._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x1049);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          local_598._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_598,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_488,(fmt *)local_598,(string *)"inputs:fallback",
                     (char (*) [16])&local_5b8,warn);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_488._0_8_,local_488._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if ((undefined1 *)local_488._0_8_ != local_478) {
            operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588) {
            operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
          }
          if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)err != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar12 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                (local_598,
                                 (ulong)(((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)err)->_metas).interpolation);
            pcVar1 = (char *)(puVar12 + 2);
            if ((char *)*puVar12 == pcVar1) {
              local_478._0_8_ = *(undefined8 *)pcVar1;
              local_478._8_8_ = puVar12[3];
              local_488._0_8_ = local_478;
            }
            else {
              local_478._0_8_ = *(undefined8 *)pcVar1;
              local_488._0_8_ = (char *)*puVar12;
            }
            local_488._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar12 + 1);
            *puVar12 = pcVar1;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_488);
            if ((undefined1 *)local_488._0_8_ != local_478) {
              operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588) {
              operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_240);
          iVar10 = 1;
          goto LAB_00236131;
        }
      }
      if (local_5b8._M_p != local_5b0 + 8) {
        operator_delete(local_5b8._M_p,local_5b0._8_8_ + 1);
      }
      if (bVar8) {
        local_498 = p_Var17 + 1;
        iVar10 = ::std::__cxx11::string::compare((char *)local_498);
        if (iVar10 == 0) {
          local_2b0._0_8_ = local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:varname","")
          ;
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_508,(key_type *)local_2b0);
          if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
          }
          if ((_Rb_tree_header *)cVar13._M_node == &local_508._M_impl.super__Rb_tree_header) {
            local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
            stack0xfffffffffffffd58 = ((ulong)stack0xfffffffffffffd58 >> 8 & 0xffffff) << 8;
            local_2a0._0_8_ = local_2a0._0_8_ & 0xffffffffffff0000;
            local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
            local_220 = (storage_t<double>)0x0;
            local_218 = false;
            local_110._16_8_ = (pointer)0x0;
            local_110._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_110._0_8_ = 0;
            local_110._8_8_ = 0;
            local_e8[0] = 0;
            local_e8[2] = 0;
            local_e8[3] = 0;
            local_270[0x10] = 0;
            local_270._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_270._8_8_ = (void *)0x0;
            local_290._16_8_ = 0;
            local_290._24_8_ = 0;
            local_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_290._8_8_ = (pointer)0x0;
            local_228 = false;
            aiStack_240._8_8_ = (pointer)0x0;
            aiStack_230[0] = (ios_base)0x0;
            aiStack_230[1] = (ios_base)0x0;
            aiStack_230[2] = (ios_base)0x0;
            aiStack_230[3] = (ios_base)0x0;
            aiStack_230[4] = (ios_base)0x0;
            aiStack_230[5] = (ios_base)0x0;
            aiStack_230[6] = (ios_base)0x0;
            aiStack_230[7] = (ios_base)0x0;
            local_258._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            aiStack_240._0_8_ = (pointer)0x0;
            local_258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_258._8_8_ = 0;
            local_1f0[0] = 0;
            local_210._16_8_ = 0;
            local_210._24_8_ = (pointer)0x0;
            local_210.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_210._8_1_ = false;
            local_210._9_3_ = 0;
            local_210._12_4_ = (storage_t<unsigned_int>)0x0;
            local_1f0[0x28] = 0;
            local_1f0._24_8_ = 0;
            local_1f0._32_8_ = 0;
            local_1f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_1f0._16_8_ = 0;
            local_1a0[0] = '\0';
            local_1c0._16_8_ = 0;
            local_1c0._24_8_ = 0;
            local_1c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_170[8] = 0;
            aStack_180._8_8_ = 0;
            auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_1a0._24_8_ = 0;
            aStack_180._M_allocated_capacity = 0;
            local_1a0._8_8_ = 0;
            local_1a0._16_8_ = 0;
            auStack_148[8] = '\0';
            auStack_170._32_8_ = (pointer)0x0;
            auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_170._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_170._24_8_ = 0;
            local_138[0x20] = 0;
            local_138._16_8_ = 0;
            local_138._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_138._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_138._8_8_ = 0;
            local_e8._16_8_ = local_e8;
            auStack_c0[0x18] = 0;
            auStack_c0._8_8_ = 0;
            auStack_c0._16_8_ = 0;
            local_c8 = 0;
            auStack_c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_98[8] = 0;
            auStack_98._9_8_ = 0;
            auStack_c0._32_8_ = 0;
            auStack_98[0] = 0;
            auStack_98._1_7_ = 0;
            local_80[0x40] = 0;
            local_80._65_8_ = 0;
            local_80._48_8_ = (storage_t<double>)0x0;
            local_80[0x38] = false;
            local_80._57_7_ = 0;
            local_80._32_8_ = 0;
            local_80._40_8_ = 0;
            local_80._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_80._24_8_ = 0;
            local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_80._8_8_ = 0;
            local_2d0._0_8_ = (long)local_2d0 + 0x10;
            local_e8._24_8_ = local_e8._16_8_;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2d0,*(long *)(p_Var17 + 1),
                       (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
            warn = (string *)local_488;
            local_488._0_8_ = local_478;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                      ((ParseResult *)local_5c0,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_508,(string *)local_2d0,local_550,warn,
                       (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
            if ((undefined1 *)local_488._0_8_ != local_478) {
              operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
            }
            if (local_2d0._0_8_ != (long)local_2d0 + 0x10) {
              operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
            }
            if (local_5c0._0_4_ == TypeMismatch) {
              local_2f0._0_8_ = local_2e0;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_2f0,*(long *)(p_Var17 + 1),
                         (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
              warn = (string *)local_488;
              local_488._0_8_ = local_478;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
              args = local_550;
              (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                        ((ParseResult *)local_598,(_anonymous_namespace_ *)&local_508,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f0,(string *)local_550,(Property *)warn,(string *)local_538,
                         (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)err);
              if ((undefined1 *)local_488._0_8_ != local_478) {
                operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
              }
              paVar4 = &local_570.field_2;
              if ((undefined8 *)local_2f0._0_8_ != local_2e0) {
                operator_delete((void *)local_2f0._0_8_,local_2e0[0] + 1);
              }
              if (local_598._0_4_ == Success) {
                iVar10 = 3;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x1062);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                local_528[0] = local_518;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_528,"Faied to parse inputs:varname: {}","");
                fmt::format<std::__cxx11::string>
                          (&local_570,(fmt *)local_528,(string *)(local_598 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_488,local_570._M_dataplus._M_p,
                                     local_570._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_570._M_dataplus._M_p != paVar4) {
                  operator_delete(local_570._M_dataplus._M_p,
                                  local_570.field_2._M_allocated_capacity + 1);
                }
                if (local_528[0] != local_518) {
                  operator_delete(local_528[0],local_518[0] + 1);
                }
                if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)err != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar15 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)local_528,
                                               (ulong)(((
                                                  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)err)->_metas).interpolation);
                  psVar3 = (size_type *)(plVar15 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar15 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar3) {
                    local_570.field_2._M_allocated_capacity = *psVar3;
                    local_570.field_2._8_8_ = plVar15[3];
                    local_570._M_dataplus._M_p = (pointer)paVar4;
                  }
                  else {
                    local_570.field_2._M_allocated_capacity = *psVar3;
                    local_570._M_dataplus._M_p = (pointer)*plVar15;
                  }
                  local_570._M_string_length = plVar15[1];
                  *plVar15 = (long)psVar3;
                  plVar15[1] = 0;
                  *(undefined1 *)(plVar15 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)&local_570);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_570._M_dataplus._M_p != paVar4) {
                    operator_delete(local_570._M_dataplus._M_p,
                                    local_570.field_2._M_allocated_capacity + 1);
                  }
                  if (local_528[0] != local_518) {
                    operator_delete(local_528[0],local_518[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
                ::std::ios_base::~ios_base(local_418);
                iVar10 = 1;
              }
              if ((undefined1 *)local_598._8_8_ != local_588 + 8) {
                operator_delete((void *)local_598._8_8_,local_588._8_8_ + 1);
              }
            }
            else {
              iVar10 = 0;
              if (local_5c0._0_4_ == Success) {
                bVar8 = ConvertTokenAttributeToStringAttribute
                                  ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                   local_2b0,local_538);
                iVar10 = 3;
                if (!bVar8) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3)
                  ;
                  poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x1050)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,
                             "Failed to convert inputs:varname token type to string type.",0x3b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"\n",1);
                  if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)err != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar15 = (long *)::std::__cxx11::string::_M_append
                                                ((char *)&local_570,
                                                 (ulong)(((
                                                  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)err)->_metas).interpolation);
                    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (plVar15 + 2);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        *plVar15 == pbVar2) {
                      local_588._0_8_ = (pbVar2->_M_dataplus)._M_p;
                      local_588._8_8_ = plVar15[3];
                      local_598._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_588;
                    }
                    else {
                      local_588._0_8_ = (pbVar2->_M_dataplus)._M_p;
                      local_598._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *plVar15;
                    }
                    local_598._8_8_ = plVar15[1];
                    *plVar15 = (long)pbVar2;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)err,(string *)local_598);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_598._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_588) {
                      operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_570._M_dataplus._M_p != &local_570.field_2) {
                      operator_delete(local_570._M_dataplus._M_p,
                                      local_570.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
                  ::std::ios_base::~ios_base(local_418);
                  iVar10 = 1;
                }
              }
            }
            if (local_5b8._M_p != local_5b0 + 8) {
              operator_delete(local_5b8._M_p,local_5b0._8_8_ + 1);
            }
            if (auStack_98[0x10] == '\x01') {
              nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
              destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       (auStack_c0 + 0x20));
            AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
            if (iVar10 != 0) goto LAB_002371ed;
          }
        }
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,*(long *)(p_Var17 + 1),
                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
        warn = (string *)local_2b0;
        local_2b0._0_8_ = local_2a0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"outputs:result","");
        anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                  ((ParseResult *)local_488,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_508,&local_310,local_550,warn,local_4a0);
        if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
        if ((local_488._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_00236898:
          bVar8 = false;
        }
        else {
          bVar8 = true;
          if (local_488._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x1068);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            local_598._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_598,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5c0,(fmt *)local_598,(string *)0x5e0dce,
                       (char (*) [15])(local_488 + 8),warn);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_5c0,(long)local_5b8._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if (local_5c0 != (undefined1  [8])local_5b0) {
              operator_delete((void *)local_5c0,(ulong)(local_5b0._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588) {
              operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
            }
            if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)err != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          (local_598,
                                           (ulong)(((
                                                  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)err)->_metas).interpolation);
              plVar15 = plVar14 + 2;
              if ((long *)*plVar14 == plVar15) {
                local_5b0._0_8_ = *plVar15;
                local_5b0._8_8_ = plVar14[3];
                local_5c0 = (undefined1  [8])local_5b0;
              }
              else {
                local_5b0._0_8_ = *plVar15;
                local_5c0 = (undefined1  [8])*plVar14;
              }
              local_5b8._M_p = (pointer)plVar14[1];
              *plVar14 = (long)plVar15;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5c0);
              if (local_5c0 != (undefined1  [8])local_5b0) {
                operator_delete((void *)local_5c0,(ulong)(local_5b0._0_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_598._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588) {
                operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base(aiStack_240);
            iVar10 = 1;
            goto LAB_00236898;
          }
        }
        if (local_488._8_8_ != (long)local_478 + 8) {
          operator_delete((void *)local_488._8_8_,local_478._8_8_ + 1);
        }
        __k = local_498;
        if (!bVar8) goto LAB_002371ed;
        cVar13 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_508,(key_type *)local_498);
        if ((_Rb_tree_header *)cVar13._M_node == &local_508._M_impl.super__Rb_tree_header) {
          pmVar16 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_4b0,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar16);
          (pmVar16->_attrib)._varying_authored = (bool)p_Var17[3].field_0x4;
          (pmVar16->_attrib)._variability = p_Var17[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar16->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar16->_attrib)._var,(any *)&p_Var17[4]._M_parent);
          (pmVar16->_attrib)._var._blocked = SUB41(p_Var17[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&(pmVar16->_attrib)._var._ts,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var17[5]._M_parent);
          (pmVar16->_attrib)._var._ts._dirty = SUB41(p_Var17[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar16->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var17[6]._M_parent);
          AttrMetas::operator=(&(pmVar16->_attrib)._metas,(AttrMetas *)(p_Var17 + 7));
          *(_Base_ptr *)&pmVar16->_listOpQual = p_Var17[0x17]._M_parent;
          (pmVar16->_rel).type = *(Type *)&p_Var17[0x17]._M_left;
          Path::operator=(&(pmVar16->_rel).targetPath,(Path *)&p_Var17[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar16->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var17[0x1e]._M_parent);
          (pmVar16->_rel).listOpQual = p_Var17[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar16->_rel)._metas,(AttrMetas *)&p_Var17[0x1f]._M_parent);
          (pmVar16->_rel)._varying_authored = *(bool *)&p_Var17[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar16->_prop_value_type_name);
          pmVar16->_has_custom = *(bool *)&p_Var17[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
        cVar13 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_508,(key_type *)__k);
        if ((_Rb_tree_header *)cVar13._M_node == &local_508._M_impl.super__Rb_tree_header) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x106a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_488,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_488._0_8_,local_488._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if ((undefined1 *)local_488._0_8_ != local_478) {
            operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
          }
          if (local_530 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar12 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                (local_5c0,
                                 (ulong)(((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)err)->_metas).interpolation);
            pcVar1 = (char *)(puVar12 + 2);
            if ((char *)*puVar12 == pcVar1) {
              local_478._0_8_ = *(undefined8 *)pcVar1;
              local_478._8_8_ = puVar12[3];
              local_488._0_8_ = local_478;
            }
            else {
              local_478._0_8_ = *(undefined8 *)pcVar1;
              local_488._0_8_ = (char *)*puVar12;
            }
            local_488._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar12 + 1);
            *puVar12 = pcVar1;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_530,(string *)local_488);
            if ((undefined1 *)local_488._0_8_ != local_478) {
              operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
            }
            if (local_5c0 != (undefined1  [8])local_5b0) {
              operator_delete((void *)local_5c0,(ulong)(local_5b0._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_240);
        }
      }
      else {
LAB_002371ed:
        if ((iVar10 != 3) && (iVar10 != 0)) break;
      }
      p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
    } while (p_Var17 != local_490);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_508,(_Link_type)local_508._M_impl.super__Rb_tree_header._M_header._M_parent);
  return false;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return false;
}